

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxchangebasis.hpp
# Opt level: O1

void __thiscall
soplex::
SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::invalidate(SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             *this)

{
  SPxOut *pSVar1;
  char cVar2;
  Verbosity old_verbosity;
  Verbosity local_1c;
  
  if ((((this->factorized != false) || (this->matrixIsSetup == true)) &&
      (pSVar1 = this->spxout, pSVar1 != (SPxOut *)0x0)) &&
     (local_1c = pSVar1->m_verbosity, 4 < (int)local_1c)) {
    (*pSVar1->_vptr_SPxOut[2])();
    pSVar1 = this->spxout;
    std::__ostream_insert<char,std::char_traits<char>>
              (pSVar1->m_streams[pSVar1->m_verbosity],
               "ICHBAS09 explicit invalidation of factorization",0x2f);
    cVar2 = (char)pSVar1->m_streams[pSVar1->m_verbosity];
    std::ios::widen((char)*(undefined8 *)(*(long *)pSVar1->m_streams[pSVar1->m_verbosity] + -0x18) +
                    cVar2);
    std::ostream::put(cVar2);
    std::ostream::flush();
    (*this->spxout->_vptr_SPxOut[2])(this->spxout,&local_1c);
  }
  this->factorized = false;
  this->matrixIsSetup = false;
  return;
}

Assistant:

void SPxBasisBase<R>::invalidate()
{
   if(factorized || matrixIsSetup)
   {
      SPX_MSG_INFO3((*this->spxout),
                    (*this->spxout) << "ICHBAS09 explicit invalidation of factorization" <<
                    std::endl;)
   }

   factorized    = false;
   matrixIsSetup = false;
}